

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void event_wake_up(tgestate_t *state)

{
  long lVar1;
  
  state->bell = '(';
  queue_message(state,message_TIME_TO_WAKE_UP);
  if (state->hero_in_bed != '\0') {
    state->vischars[0].mi.mappos.u = 0x2e;
    state->vischars[0].mi.mappos.v = 0x2e;
  }
  state->hero_in_bed = '\0';
  set_hero_route(state,(route_t *)&wake_up_t42);
  state->character_structs[0x14].room = '\x03';
  state->character_structs[0x15].room = '\x03';
  state->character_structs[0x16].room = '\x03';
  state->character_structs[0x17].room = '\x05';
  state->character_structs[0x18].room = '\x05';
  state->character_structs[0x19].room = '\x05';
  set_prisoners_and_guards_route_B(state,(route_t *)&wake_up_t5);
  lVar1 = 0;
  do {
    set_roomdef(state,beds[lVar1].room_index,(uint)beds[lVar1].offset,9);
    lVar1 = lVar1 + 1;
  } while ((char)lVar1 != '\x06');
  set_roomdef(state,'\x02',0x1a,9);
  if ((byte)(state->room_index - 1) < 5) {
    setup_room(state);
    plot_interior_tiles(state);
    return;
  }
  return;
}

Assistant:

static void event_wake_up(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_TIME_TO_WAKE_UP);
  wake_up(state);
}